

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SizedPtr __thiscall google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this)

{
  undefined1 auVar1 [16];
  SerialArenaChunk *pSVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  string *psVar6;
  size_type sVar7;
  undefined8 uVar8;
  SizedPtr *this_00;
  pointer pcVar9;
  __pointer_type this_01;
  long lVar10;
  GetDeallocator deallocator_00;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar11;
  SizedPtr SVar12;
  SizedPtr mem;
  SerialArena *serial;
  GetDeallocator deallocator;
  SizedPtr local_78;
  SerialArena *local_68;
  ThreadSafeArena *local_60;
  SerialArenaChunk *local_58;
  SerialArenaChunk *local_50;
  GetDeallocator local_48;
  void *local_40 [2];
  
  this_00 = &local_78;
  uVar5 = (this->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar5 == 0) {
    deallocator_00.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    deallocator_00.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar5 + 0x18);
  }
  this_01 = (this->head_)._M_b._M_p;
  local_60 = this;
  local_48.dealloc_ = deallocator_00.dealloc_;
  do {
    bVar3 = SerialArenaChunk::IsSentry(this_01);
    if (bVar3) {
      SVar12 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                         (&local_60->first_arena_,deallocator_00);
      return SVar12;
    }
    local_58 = SerialArenaChunk::next_chunk(this_01);
    local_50 = this_01;
    SVar11 = SerialArenaChunk::arenas(this_01);
    for (lVar10 = SVar11.len_ << 3; pSVar2 = local_50, lVar10 != 0; lVar10 = lVar10 + -8) {
      local_68 = *(SerialArena **)((long)&SVar11.ptr_[-1]._M_b._M_p + lVar10);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_78.n;
      local_78 = (SizedPtr)(auVar1 << 0x40);
      psVar6 = absl::lts_20240722::log_internal::
               Check_NEImpl<google::protobuf::internal::SerialArena*,decltype(nullptr)>
                         (&local_68,&local_78.p,"serial != nullptr");
      if (psVar6 != (string *)0x0) {
        pcVar9 = (psVar6->_M_dataplus)._M_p;
        sVar7 = psVar6->_M_string_length;
        uVar8 = 0x2f8;
LAB_001a5ecc:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
                   ,uVar8,sVar7,pcVar9);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)this_00);
      }
      local_78 = SerialArena::
                 Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                           (local_68,deallocator_00);
      local_40[0] = (void *)0x0;
      psVar6 = absl::lts_20240722::log_internal::Check_NEImpl<void*,decltype(nullptr)>
                         (&local_78.p,local_40,"mem.p != nullptr");
      if (psVar6 != (string *)0x0) {
        pcVar9 = (psVar6->_M_dataplus)._M_p;
        sVar7 = psVar6->_M_string_length;
        this_00 = (SizedPtr *)local_40;
        uVar8 = 0x2fb;
        goto LAB_001a5ecc;
      }
      anon_unknown_12::GetDeallocator::operator()(&local_48,local_78);
    }
    uVar4 = SerialArenaChunk::capacity(local_50);
    operator_delete(pSVar2,(ulong)uVar4 * 0x10 + 0x10);
    this_01 = local_58;
  } while( true );
}

Assistant:

ArenaBlock* SentryArenaBlock() {
  static const ArenaBlock kSentryArenaBlock;
  // const_cast<> is okay as kSentryArenaBlock will never be mutated.
  return const_cast<ArenaBlock*>(&kSentryArenaBlock);
}